

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanosvg.h
# Opt level: O2

void nsvg__parseTransform(float *xform,char *str)

{
  int iVar1;
  int iVar2;
  float fVar3;
  float fVar4;
  undefined8 local_a8;
  ulong uStack_a0;
  ulong local_98;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float fStack_78;
  undefined4 uStack_74;
  int na;
  float args [1];
  float fStack_64;
  undefined8 uStack_60;
  undefined8 local_58;
  float local_3c;
  ulong local_38;
  
  xform[0] = 1.0;
  xform[1] = 0.0;
  xform[2] = 0.0;
  xform[3] = 1.0;
  xform[4] = 0.0;
  xform[5] = 0.0;
LAB_001184b9:
  do {
    if (*str == '\0') {
      return;
    }
    iVar2 = strncmp(str,"matrix",6);
    if (iVar2 == 0) {
      local_a8 = local_a8 & 0xffffffff00000000;
      iVar2 = nsvg__parseTransformArgs(str,args,6,(int *)&local_a8);
      if ((float)local_a8 == 8.40779e-45) {
        fStack_78 = (float)local_58;
        uStack_74 = (float)((ulong)local_58 >> 0x20);
        local_88 = (float)_args;
        fStack_84 = (float)((ulong)_args >> 0x20);
        fStack_80 = (float)uStack_60;
        fStack_7c = (float)((ulong)uStack_60 >> 0x20);
      }
    }
    else {
      iVar2 = strncmp(str,"translate",9);
      if (iVar2 == 0) {
        local_a8 = local_a8 & 0xffffffff00000000;
        iVar2 = nsvg__parseTransformArgs(str,args,2,(int *)&local_a8);
        uStack_74 = (float)0;
        if ((float)local_a8 != 1.4013e-45) {
          uStack_74 = fStack_64;
        }
        local_88 = 1.0;
        fStack_84 = 0.0;
        fStack_80 = 0.0;
        fStack_7c = 1.0;
        fStack_78 = args[0];
      }
      else {
        iVar2 = strncmp(str,"scale",5);
        if (iVar2 == 0) {
          local_a8 = local_a8 & 0xffffffff00000000;
          iVar2 = nsvg__parseTransformArgs(str,args,2,(int *)&local_a8);
          fStack_7c = args[0];
          if ((float)local_a8 != 1.4013e-45) {
            fStack_7c = fStack_64;
          }
          local_88 = args[0];
          fStack_84 = 0.0;
          fStack_80 = 0.0;
          fStack_78 = 0.0;
          uStack_74 = 0.0;
        }
        else {
          iVar2 = strncmp(str,"rotate",6);
          if (iVar2 == 0) {
            na = 0;
            iVar2 = nsvg__parseTransformArgs(str,&local_3c,3,&na);
            iVar1 = na;
            if (na == 1) {
              local_38 = 0;
            }
            _args = 0x3f800000;
            uStack_60 = 0x3f80000000000000;
            local_58 = 0;
            if (1 < na) {
              local_a8 = 0x3f800000;
              uStack_a0 = 0x3f80000000000000;
              local_98 = local_38 ^ 0x8000000080000000;
              nsvg__xformMultiply(args,(float *)&local_a8);
            }
            fVar3 = (local_3c / 180.0) * 3.1415927;
            fVar4 = cosf(fVar3);
            fVar3 = sinf(fVar3);
            local_a8 = CONCAT44(fVar3,fVar4);
            uStack_a0 = CONCAT44(fVar4,fVar3) ^ 0x80000000;
            local_98 = 0;
            nsvg__xformMultiply(args,(float *)&local_a8);
            if (1 < iVar1) {
              local_a8 = 0x3f800000;
              uStack_a0 = 0x3f80000000000000;
              local_98 = local_38;
              nsvg__xformMultiply(args,(float *)&local_a8);
            }
            fStack_78 = 0.0;
            uStack_74 = 0.0;
            local_88 = (float)_args;
            fStack_84 = (float)((ulong)_args >> 0x20);
            fStack_80 = 0.0;
            fStack_7c = 1.0;
          }
          else {
            iVar2 = strncmp(str,"skewX",5);
            if (iVar2 == 0) {
              local_a8 = local_a8 & 0xffffffff00000000;
              iVar2 = nsvg__parseTransformArgs(str,args,1,(int *)&local_a8);
              fStack_80 = tanf((args[0] / 180.0) * 3.1415927);
              local_88 = 1.0;
              fStack_84 = 0.0;
              fStack_7c = 1.0;
              fStack_78 = 0.0;
              uStack_74 = 0.0;
            }
            else {
              iVar2 = strncmp(str,"skewY",5);
              if (iVar2 != 0) {
                str = str + 1;
                goto LAB_001184b9;
              }
              local_a8 = local_a8 & 0xffffffff00000000;
              iVar2 = nsvg__parseTransformArgs(str,args,1,(int *)&local_a8);
              fStack_84 = tanf((args[0] / 180.0) * 3.1415927);
              local_88 = 1.0;
              fStack_80 = 0.0;
              fStack_7c = 1.0;
              fStack_78 = 0.0;
              uStack_74 = 0.0;
            }
          }
        }
      }
    }
    str = str + iVar2;
    nsvg__xformPremultiply(xform,&local_88);
  } while( true );
}

Assistant:

static void nsvg__parseTransform(float* xform, const char* str)
{
	float t[6];
	nsvg__xformIdentity(xform);
	while (*str)
	{
		if (strncmp(str, "matrix", 6) == 0)
			str += nsvg__parseMatrix(t, str);
		else if (strncmp(str, "translate", 9) == 0)
			str += nsvg__parseTranslate(t, str);
		else if (strncmp(str, "scale", 5) == 0)
			str += nsvg__parseScale(t, str);
		else if (strncmp(str, "rotate", 6) == 0)
			str += nsvg__parseRotate(t, str);
		else if (strncmp(str, "skewX", 5) == 0)
			str += nsvg__parseSkewX(t, str);
		else if (strncmp(str, "skewY", 5) == 0)
			str += nsvg__parseSkewY(t, str);
		else{
			++str;
			continue;
		}

		nsvg__xformPremultiply(xform, t);
	}
}